

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dictionary_decoder.cpp
# Opt level: O1

idx_t __thiscall
duckdb::DictionaryDecoder::GetValidValues
          (DictionaryDecoder *this,uint8_t *defines,idx_t read_count,idx_t result_offset)

{
  sel_t *psVar1;
  sel_t *psVar2;
  idx_t iVar3;
  idx_t iVar4;
  idx_t iVar5;
  idx_t valid_count;
  idx_t iVar6;
  
  if (defines == (uint8_t *)0x0) {
    return read_count;
  }
  if (read_count != 0) {
    psVar1 = (this->valid_sel).sel_vector;
    iVar4 = this->dictionary_size;
    psVar2 = (this->dictionary_selection_vector).sel_vector;
    iVar3 = this->reader->column_schema->max_define;
    iVar6 = 0;
    iVar5 = 0;
    do {
      psVar1[iVar5] = (sel_t)iVar6;
      psVar2[iVar6] = (sel_t)iVar4;
      iVar5 = iVar5 + (iVar3 == defines[iVar6 + result_offset]);
      iVar6 = iVar6 + 1;
    } while (read_count != iVar6);
    return iVar5;
  }
  return 0;
}

Assistant:

idx_t DictionaryDecoder::GetValidValues(uint8_t *defines, idx_t read_count, idx_t result_offset) {
	idx_t valid_count = read_count;
	if (defines) {
		D_ASSERT(can_have_nulls);
		valid_count = 0;
		for (idx_t i = 0; i < read_count; i++) {
			valid_sel.set_index(valid_count, i);
			dictionary_selection_vector.set_index(i, dictionary_size);
			valid_count += defines[result_offset + i] == reader.MaxDefine();
		}
	}
	return valid_count;
}